

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver_test.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::
NameResolverTest_NestInFileClassEnumEdition2024_Test::TestBody
          (NameResolverTest_NestInFileClassEnumEdition2024_Test *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  long *plVar3;
  FileDescriptor *this_00;
  EnumDescriptor *descriptor;
  EnumDescriptor *descriptor_00;
  Descriptor *this_01;
  EnumDescriptor *descriptor_01;
  char *pcVar4;
  string_view filename;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view contents;
  AssertionResult gtest_ar;
  ClassNameResolver resolver;
  AssertHelper AStack_f8;
  internal local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  undefined1 local_e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined2 local_98;
  ClassNameResolver local_90;
  
  filename._M_str = "foo.proto";
  filename._M_len = 9;
  contents._M_str =
       "\n      edition = \"2024\";\n      import \"third_party/java/protobuf/java_features.proto\";\n      package proto2_unittest;\n      enum NestedInFileClassEnum {\n        option features.(pb.java).nest_in_file_class = YES;\n\n        FOO_DEFAULT = 0;\n        FOO_VALUE = 1;\n      }\n\n      enum UnnestedEnum {\n        BAR_DEFAULT = 0;\n        BAR_VALUE = 1;\n      }\n\n      message EnumWrapper {\n        enum NestedInEnumWrapper {\n          BAZ_DEFAULT = 0;\n          BAZ_VALUE = 1;\n        }\n      }\n                "
  ;
  contents._M_len = 0x1f7;
  NameResolverTest::BuildFileAndPopulatePool(&this->super_NameResolverTest,filename,contents);
  local_e0[0] = false;
  local_e0[1] = false;
  local_e0[2] = false;
  local_e0[3] = false;
  local_e0[4] = true;
  local_e0[5] = false;
  local_e0._16_8_ = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98._0_1_ = false;
  local_98._1_1_ = true;
  local_e0._8_8_ = &local_c8;
  local_b8._M_p = (pointer)&local_a8;
  ClassNameResolver::ClassNameResolver(&local_90,(Options *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,
                    CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._8_8_ != &local_c8) {
    operator_delete((void *)local_e0._8_8_,
                    CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
  }
  name._M_str = "foo.proto";
  name._M_len = 9;
  this_00 = DescriptorPool::FindFileByName(&(this->super_NameResolverTest).pool_,name);
  name_00._M_str = "NestedInFileClassEnum";
  name_00._M_len = 0x15;
  descriptor = FileDescriptor::FindEnumTypeByName(this_00,name_00);
  name_01._M_str = "UnnestedEnum";
  name_01._M_len = 0xc;
  descriptor_00 = FileDescriptor::FindEnumTypeByName(this_00,name_01);
  name_02._M_str = "EnumWrapper";
  name_02._M_len = 0xb;
  this_01 = FileDescriptor::FindMessageTypeByName(this_00,name_02);
  name_03._M_str = "NestedInEnumWrapper";
  name_03._M_len = 0x13;
  descriptor_01 = Descriptor::FindEnumTypeByName(this_01,name_03);
  ClassNameResolver::GetClassName_abi_cxx11_((string *)local_e0,&local_90,descriptor_00,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[29]>
            (local_f0,"resolver.GetClassName(unnested_enum, true)",
             "\"\" \"proto2_unittest.UnnestedEnum\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
             (char (*) [29])"proto2_unittest.UnnestedEnum");
  puVar1 = local_e0 + 0x10;
  puVar2 = (undefined1 *)CONCAT26(local_e0._6_2_,CONCAT24(local_e0._4_2_,local_e0._0_4_));
  if (puVar2 != puVar1) {
    operator_delete(puVar2,local_e0._16_8_ + 1);
  }
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e0);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x187,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_f8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_f8);
    plVar3 = (long *)CONCAT26(local_e0._6_2_,CONCAT24(local_e0._4_2_,local_e0._0_4_));
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  ClassNameResolver::GetClassName_abi_cxx11_((string *)local_e0,&local_90,descriptor,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[47]>
            (local_f0,"resolver.GetClassName(nest_in_file_enum, true)",
             "\"\" \"proto2_unittest.FooProto.NestedInFileClassEnum\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
             (char (*) [47])"proto2_unittest.FooProto.NestedInFileClassEnum");
  puVar2 = (undefined1 *)CONCAT26(local_e0._6_2_,CONCAT24(local_e0._4_2_,local_e0._0_4_));
  if (puVar2 != puVar1) {
    operator_delete(puVar2,local_e0._16_8_ + 1);
  }
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e0);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x18a,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_f8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_f8);
    plVar3 = (long *)CONCAT26(local_e0._6_2_,CONCAT24(local_e0._4_2_,local_e0._0_4_));
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  ClassNameResolver::GetClassName_abi_cxx11_((string *)local_e0,&local_90,descriptor_01,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[48]>
            (local_f0,"resolver.GetClassName(nested_in_enum_wrapper, true)",
             "\"\" \"proto2_unittest.EnumWrapper.NestedInEnumWrapper\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
             (char (*) [48])"proto2_unittest.EnumWrapper.NestedInEnumWrapper");
  puVar2 = (undefined1 *)CONCAT26(local_e0._6_2_,CONCAT24(local_e0._4_2_,local_e0._0_4_));
  if (puVar2 != puVar1) {
    operator_delete(puVar2,local_e0._16_8_ + 1);
  }
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e0);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x18d,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_f8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_f8);
    plVar3 = (long *)CONCAT26(local_e0._6_2_,CONCAT24(local_e0._4_2_,local_e0._0_4_));
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_
            ((string *)local_e0,&local_90,descriptor_00);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[29]>
            (local_f0,"resolver.GetJavaImmutableClassName(unnested_enum)",
             "\"\" \"proto2_unittest.UnnestedEnum\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
             (char (*) [29])"proto2_unittest.UnnestedEnum");
  puVar2 = (undefined1 *)CONCAT26(local_e0._6_2_,CONCAT24(local_e0._4_2_,local_e0._0_4_));
  if (puVar2 != puVar1) {
    operator_delete(puVar2,local_e0._16_8_ + 1);
  }
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e0);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,399,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_f8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_f8);
    plVar3 = (long *)CONCAT26(local_e0._6_2_,CONCAT24(local_e0._4_2_,local_e0._0_4_));
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_((string *)local_e0,&local_90,descriptor);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[47]>
            (local_f0,"resolver.GetJavaImmutableClassName(nest_in_file_enum)",
             "\"\" \"proto2_unittest.FooProto$NestedInFileClassEnum\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
             (char (*) [47])"proto2_unittest.FooProto$NestedInFileClassEnum");
  puVar2 = (undefined1 *)CONCAT26(local_e0._6_2_,CONCAT24(local_e0._4_2_,local_e0._0_4_));
  if (puVar2 != puVar1) {
    operator_delete(puVar2,local_e0._16_8_ + 1);
  }
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e0);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x191,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_f8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_f8);
    plVar3 = (long *)CONCAT26(local_e0._6_2_,CONCAT24(local_e0._4_2_,local_e0._0_4_));
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_
            ((string *)local_e0,&local_90,descriptor_01);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[48]>
            (local_f0,"resolver.GetJavaImmutableClassName(nested_in_enum_wrapper)",
             "\"\" \"proto2_unittest.EnumWrapper$NestedInEnumWrapper\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
             (char (*) [48])"proto2_unittest.EnumWrapper$NestedInEnumWrapper");
  puVar2 = (undefined1 *)CONCAT26(local_e0._6_2_,CONCAT24(local_e0._4_2_,local_e0._0_4_));
  if (puVar2 != puVar1) {
    operator_delete(puVar2,local_e0._16_8_ + 1);
  }
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e0);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x193,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_f8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_f8);
    plVar3 = (long *)CONCAT26(local_e0._6_2_,CONCAT24(local_e0._4_2_,local_e0._0_4_));
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  ClassNameResolver::~ClassNameResolver(&local_90);
  return;
}

Assistant:

TEST_F(NameResolverTest, NestInFileClassEnumEdition2024) {
  BuildFileAndPopulatePool("foo.proto",
                           R"schema(
      edition = "2024";
      import "third_party/java/protobuf/java_features.proto";
      package proto2_unittest;
      enum NestedInFileClassEnum {
        option features.(pb.java).nest_in_file_class = YES;

        FOO_DEFAULT = 0;
        FOO_VALUE = 1;
      }

      enum UnnestedEnum {
        BAR_DEFAULT = 0;
        BAR_VALUE = 1;
      }

      message EnumWrapper {
        enum NestedInEnumWrapper {
          BAZ_DEFAULT = 0;
          BAZ_VALUE = 1;
        }
      }
                )schema");

  ClassNameResolver resolver;
  auto file = pool_.FindFileByName("foo.proto");
  auto nest_in_file_enum = file->FindEnumTypeByName("NestedInFileClassEnum");
  auto unnested_enum = file->FindEnumTypeByName("UnnestedEnum");
  auto nested_in_enum_wrapper = file->FindMessageTypeByName("EnumWrapper")
                                    ->FindEnumTypeByName("NestedInEnumWrapper");

  EXPECT_EQ(resolver.GetClassName(unnested_enum,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.UnnestedEnum");
  EXPECT_EQ(resolver.GetClassName(nest_in_file_enum,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.FooProto.NestedInFileClassEnum");
  EXPECT_EQ(resolver.GetClassName(nested_in_enum_wrapper,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.EnumWrapper.NestedInEnumWrapper");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(unnested_enum),
            PACKAGE_PREFIX "proto2_unittest.UnnestedEnum");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(nest_in_file_enum),
            PACKAGE_PREFIX "proto2_unittest.FooProto$NestedInFileClassEnum");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(nested_in_enum_wrapper),
            PACKAGE_PREFIX "proto2_unittest.EnumWrapper$NestedInEnumWrapper");
}